

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_1.cpp
# Opt level: O0

void __thiscall
ImporterStrict_sineCellml11Import_Test::TestBody(ImporterStrict_sineCellml11Import_Test *this)

{
  pointer *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  const_reference lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  AssertionResult local_3d8 [2];
  AssertHelper local_3b8 [8];
  Message local_3b0 [15];
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__1;
  Message local_388 [8];
  shared_ptr<libcellml::AnyCellmlElement> local_380;
  shared_ptr<libcellml::ImportSource> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_3;
  IssuePtr issue;
  size_t i;
  Message local_310 [8];
  unsigned_long local_308;
  unsigned_long local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_2;
  ScopedTrace local_2d1;
  AssertHelper local_2d0 [7];
  ScopedTrace gtest_trace_52;
  Message local_2c8 [8];
  unsigned_long local_2c0 [2];
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_1;
  string local_298 [32];
  string local_278 [32];
  AssertionResult local_258 [2];
  AssertHelper local_238 [8];
  Message local_230 [15];
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_;
  ScopedTrace local_1f9;
  AssertHelper local_1f8 [7];
  ScopedTrace gtest_trace_47;
  Message local_1f0 [8];
  unsigned_long local_1e8 [2];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  string local_1c0 [32];
  string local_1a0 [32];
  undefined1 local_180 [8];
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  string local_100 [32];
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedImporterIssueUrls;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedImporterIssues;
  ImporterStrict_sineCellml11Import_Test *this_local;
  
  expectedImporterIssueUrls.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
  local_a0 = &local_98;
  expectedImporterIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0."
             ,&local_a1);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0."
             ,(allocator<char> *)
              ((long)&expectedImporterIssueUrls.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0."
             ,(allocator<char> *)
              ((long)&expectedImporterIssueUrls.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  expectedImporterIssueUrls.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  local_38 = &local_98;
  local_30 = 3;
  this_00 = &expectedImporterIssueUrls.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l_00,(allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&expectedImporterIssueUrls.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_418 = local_418 + -1;
    std::__cxx11::string::~string((string *)local_418);
  } while (local_418 != &local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expectedImporterIssueUrls.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expectedImporterIssueUrls.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator(&local_a1);
  parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
       1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"sin.xml",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"deriv_approx_sin.xml",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"parabolic_approx_sin.xml",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
       0;
  local_e0 = &local_140;
  local_d8 = 3;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0,__l,this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 3));
  local_468 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_468 = local_468 + -1;
    std::__cxx11::string::~string((string *)local_468);
  } while (local_468 != &local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  this_02 = &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_02,0));
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,"cellml1X/sin_approximations_import.xml",
             (allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  fileContents(local_1a0);
  libcellml::Parser::parseModel((string *)local_180);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_1e8[1] = 3;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_1e8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1d8,"size_t(3)","parser->issueCount()",local_1e8 + 1,local_1e8
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(local_1f8,local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    testing::Message::~Message(local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  testing::ScopedTrace::ScopedTrace
            (&local_1f9,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
             ,0x2f,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Parser,void>
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_.message_,
             (shared_ptr<libcellml::Parser> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  expectEqualIssues((vector *)&expectedParserIssues_abi_cxx11_,(shared_ptr *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Logger>::~shared_ptr
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_.message_);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_180);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_221 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_258,local_220,"model->hasUnresolvedImports()","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(local_238,local_230);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    std::__cxx11::string::~string((string *)local_258);
    testing::Message::~Message(local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  peVar4 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"cellml1X",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  resourcePath(local_278);
  libcellml::Importer::resolveImports((shared_ptr *)peVar4,(string *)local_180);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_2c0[1] = 3;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2c0[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2b0,"size_t(3)","importer->issueCount()",local_2c0 + 1,
             local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(local_2d0,local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_2d0);
    testing::Message::~Message(local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  testing::ScopedTrace::ScopedTrace
            (&local_2d1,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
             ,0x34,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Importer,void>
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_2.message_,
             (shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expectEqualIssues((vector *)local_28,(shared_ptr *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Logger>::~shared_ptr
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_2.message_);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_300 = libcellml::Logger::issueCount();
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_308 = libcellml::Logger::messageCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2f8,"importer->issueCount()","importer->messageCount()",
             &local_300,&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(local_310);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)libcellml::Logger::messageCount();
    if (p_Var5 <= issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi) break;
    std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    libcellml::Logger::message((ulong)&gtest_ar_3.message_);
    lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,
               (size_type)
               issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &gtest_ar_3.message_);
    libcellml::Issue::item();
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_380);
    libcellml::AnyCellmlElement::importSource();
    std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&local_370);
    libcellml::ImportSource::url_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_340,"expectedImporterIssueUrls.at(i)",
               "issue->item()->importSource()->url()",lhs,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_370);
    std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr(&local_380);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar1) {
      testing::Message::Message(local_388);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
                 ,0x38,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_388);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    std::shared_ptr<libcellml::Issue>::~shared_ptr
              ((shared_ptr<libcellml::Issue> *)&gtest_ar_3.message_);
    issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
         1;
  }
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_180);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_3a1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_3d8,local_3a0,"model->hasUnresolvedImports()","true");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=(local_3b8,local_3b0);
    testing::internal::AssertHelper::~AssertHelper(local_3b8);
    std::__cxx11::string::~string((string *)local_3d8);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  testing::ScopedTrace::~ScopedTrace(&local_2d1);
  testing::ScopedTrace::~ScopedTrace(&local_1f9);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_180);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(ImporterStrict, sineCellml11Import)
{
    const std::vector<std::string> expectedImporterIssues = {
        "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0.",
        "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0.",
        "Given model is a CellML 1.1 model, the parser will try to represent this model in CellML 2.0.",
    };
    const std::vector<std::string> expectedImporterIssueUrls = {
        "sin.xml",
        "deriv_approx_sin.xml",
        "parabolic_approx_sin.xml",
    };

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ImporterPtr importer = libcellml::Importer::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/sin_approximations_import.xml"));

    EXPECT_EQ(size_t(3), parser->issueCount());
    EXPECT_EQ_ISSUES(expectedParserIssues, parser);
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("cellml1X"));
    EXPECT_EQ(size_t(3), importer->issueCount());
    EXPECT_EQ_ISSUES(expectedImporterIssues, importer);
    EXPECT_EQ(importer->issueCount(), importer->messageCount());
    for (size_t i = 0; i < importer->messageCount(); ++i) {
        auto issue = importer->message(i);
        EXPECT_EQ(expectedImporterIssueUrls.at(i), issue->item()->importSource()->url());
    }
    EXPECT_FALSE(model->hasUnresolvedImports());
}